

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O2

char * archive_entry_copy_fflags_text(archive_entry *entry,char *flags)

{
  byte *pbVar1;
  ulong uVar2;
  byte *pbVar3;
  
  archive_mstring_copy_mbs(&entry->ae_fflags_text,flags);
  while ((uVar2 = (ulong)(byte)*flags, uVar2 < 0x2d &&
         ((0x100100000200U >> (uVar2 & 0x3f) & 1) != 0))) {
    flags = (char *)((byte *)flags + 1);
  }
  pbVar1 = (byte *)0x0;
  while (pbVar3 = (byte *)flags, flags = (char *)pbVar3, (char)uVar2 != '\0') {
    while ((0x2c < (byte)uVar2 || ((0x100100000201U >> (uVar2 & 0x3f) & 1) == 0))) {
      uVar2 = (ulong)((byte *)flags)[1];
      flags = (char *)((byte *)flags + 1);
    }
    while ((uVar2 = (ulong)(byte)*flags, uVar2 < 0x2d &&
           ((0x100100000200U >> (uVar2 & 0x3f) & 1) != 0))) {
      flags = (char *)((byte *)flags + 1);
    }
    if (pbVar1 == (byte *)0x0) {
      pbVar1 = pbVar3;
    }
  }
  entry->ae_fflags_set = 0;
  entry->ae_fflags_clear = 0;
  return (char *)pbVar1;
}

Assistant:

const char *
archive_entry_copy_fflags_text(struct archive_entry *entry,
    const char *flags)
{
	archive_mstring_copy_mbs(&entry->ae_fflags_text, flags);
	return (ae_strtofflags(flags,
		    &entry->ae_fflags_set, &entry->ae_fflags_clear));
}